

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O0

HighsStatus
normaliseNames(HighsLogOptions *log_options,string *name_type,HighsInt num_name,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *names,HighsInt *max_name_length)

{
  int iVar1;
  HighsInt HVar2;
  undefined8 uVar3;
  reference this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RCX;
  int in_EDX;
  ulong in_RSI;
  HighsLogOptions *in_RDI;
  int *in_R8;
  HighsInt ix_1;
  bool construct_names;
  HighsInt ix;
  bool names_with_spaces;
  string name_prefix;
  HighsInt num_empty_name;
  HighsInt desired_max_name_length;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  undefined4 uVar4;
  char cVar5;
  HighsInt in_stack_ffffffffffffff34;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  string local_b8 [32];
  string local_98 [4];
  int in_stack_ffffffffffffff6c;
  int local_74;
  int local_60;
  bool local_59;
  string local_58 [32];
  int local_38;
  int local_34;
  int *local_30;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_28;
  int local_1c;
  HighsLogOptions *local_10;
  HighsStatus local_4;
  
  local_34 = *in_R8;
  local_38 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_1c = in_EDX;
  local_10 = in_RDI;
  std::__cxx11::string::substr((ulong)local_58,in_RSI);
  local_59 = false;
  for (local_60 = 0; HVar2 = (HighsInt)(in_RSI >> 0x20), local_60 < local_1c;
      local_60 = local_60 + 1) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](local_28,(long)local_60);
    iVar1 = std::__cxx11::string::length();
    if (iVar1 == 0) {
      local_38 = local_38 + 1;
    }
  }
  if (local_38 == 0) {
    in_stack_ffffffffffffff34 =
         maxNameLength(in_stack_ffffffffffffff34,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_ffffffffffffff28);
    *local_30 = in_stack_ffffffffffffff34;
  }
  uVar4 = CONCAT13(1,(int3)in_stack_ffffffffffffff30);
  if (local_38 == 0) {
    uVar4 = CONCAT13(local_34 < *local_30,(int3)in_stack_ffffffffffffff30);
  }
  cVar5 = (char)((uint)uVar4 >> 0x18);
  if (cVar5 == '\0') {
    local_59 = hasNamesWithSpaces((HighsLogOptions *)
                                  CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                                  HVar2,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         *)CONCAT44(in_stack_ffffffffffffff34,uVar4));
  }
  else {
    in_stack_ffffffffffffff28 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         std::__cxx11::string::c_str();
    uVar3 = std::__cxx11::string::c_str();
    highsLogUser(local_10,kWarning,
                 "There are empty or excessively-long %s names: using constructed names with prefix \"%s\"\n"
                 ,in_stack_ffffffffffffff28,uVar3);
    for (local_74 = 0; local_74 < local_1c; local_74 = local_74 + 1) {
      std::__cxx11::to_string(in_stack_ffffffffffffff6c);
      std::operator+(in_stack_ffffffffffffff28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
      this = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](local_28,(long)local_74);
      std::__cxx11::string::operator=((string *)this,local_98);
      std::__cxx11::string::~string(local_98);
      std::__cxx11::string::~string(local_b8);
    }
  }
  HVar2 = maxNameLength(in_stack_ffffffffffffff34,
                        (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_ffffffffffffff28);
  *local_30 = HVar2;
  if ((*local_30 < 9) || (local_59 == false)) {
    if (cVar5 == '\0') {
      local_4 = kOk;
    }
    else {
      local_4 = kWarning;
    }
  }
  else {
    local_4 = kError;
  }
  std::__cxx11::string::~string(local_58);
  return local_4;
}

Assistant:

HighsStatus normaliseNames(const HighsLogOptions& log_options,
                           const std::string name_type, const HighsInt num_name,
                           std::vector<std::string>& names,
                           HighsInt& max_name_length) {
  // Record the desired maximum name length
  HighsInt desired_max_name_length = max_name_length;
  // First look for empty names
  HighsInt num_empty_name = 0;
  std::string name_prefix = name_type.substr(0, 1);
  bool names_with_spaces = false;
  for (HighsInt ix = 0; ix < num_name; ix++) {
    if ((HighsInt)names[ix].length() == 0) num_empty_name++;
  }
  // If there are no empty names - in which case they will all be
  // replaced - find the maximum name length
  if (!num_empty_name) max_name_length = maxNameLength(num_name, names);
  bool construct_names =
      num_empty_name || max_name_length > desired_max_name_length;
  if (construct_names) {
    // Construct names, either because they are empty names, or
    // because the existing names are too long

    highsLogUser(log_options, HighsLogType::kWarning,
                 "There are empty or excessively-long %s names: using "
                 "constructed names with prefix \"%s\"\n",
                 name_type.c_str(), name_prefix.c_str());
    for (HighsInt ix = 0; ix < num_name; ix++)
      names[ix] = name_prefix + std::to_string(ix);
  } else {
    // Using original names, so look to see whether there are names with spaces
    names_with_spaces = hasNamesWithSpaces(log_options, num_name, names);
  }
  // Find the final maximum name length
  max_name_length = maxNameLength(num_name, names);
  // Can't have names with spaces and more than 8 characters
  if (max_name_length > 8 && names_with_spaces) return HighsStatus::kError;
  if (construct_names) return HighsStatus::kWarning;
  return HighsStatus::kOk;
}